

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bit_field.cpp
# Opt level: O1

void __thiscall
BitFieldAssignment_Assignment_Test<(anonymous_namespace)::param<unsigned_short,_0U,_16U>_>::
~BitFieldAssignment_Assignment_Test
          (BitFieldAssignment_Assignment_Test<(anonymous_namespace)::param<unsigned_short,_0U,_16U>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (BitFieldAssignment, Assignment) {
    using value_type = typename TypeParam::value_type;
    value_type const index = typename TypeParam::index ();
    value_type const bits = typename TypeParam::bits ();

    union {
        value_type vt;
        pstore::bit_field<value_type, index, bits> f1;
    };
    // set all of the bits to 1.
    vt = std::numeric_limits<value_type>::max ();
    // now blast values into f1.
    f1 = value_type{0};
    using assign_type = typename decltype (f1)::assign_type;
    EXPECT_EQ (f1.value (), static_cast<assign_type> (0U));
    f1 = value_type{1};
    EXPECT_EQ (f1.value (), static_cast<assign_type> (1U));
    constexpr auto v = decltype (f1)::max ();
    EXPECT_EQ (pstore::bit_count::pop_count (v), bits);
    f1 = v;
    // access the value of f1 by casting directly rather than using the value() member function.
    EXPECT_EQ (static_cast<value_type> (f1), v);
    EXPECT_EQ (vt, std::numeric_limits<value_type>::max ());
}